

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::SolveBeforeConstraintSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,SolveBeforeConstraintSyntax *this,size_t index
          )

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *local_80;
  SyntaxNode *local_70;
  size_t index_local;
  SolveBeforeConstraintSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->solve).kind;
    token._2_1_ = (this->solve).field_0x2;
    token.numFlags.raw = (this->solve).numFlags.raw;
    token.rawLen = (this->solve).rawLen;
    token.info = (this->solve).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    local_70 = (SyntaxNode *)0x0;
    if (this != (SolveBeforeConstraintSyntax *)0xffffffffffffffe0) {
      local_70 = &(this->beforeExpr).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 2:
    token_00.kind = (this->before).kind;
    token_00._2_1_ = (this->before).field_0x2;
    token_00.numFlags.raw = (this->before).numFlags.raw;
    token_00.rawLen = (this->before).rawLen;
    token_00.info = (this->before).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    local_80 = (SyntaxNode *)0x0;
    if (this != (SolveBeforeConstraintSyntax *)0xffffffffffffffa0) {
      local_80 = &(this->afterExpr).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 4:
    token_01.kind = (this->semi).kind;
    token_01._2_1_ = (this->semi).field_0x2;
    token_01.numFlags.raw = (this->semi).numFlags.raw;
    token_01.rawLen = (this->semi).rawLen;
    token_01.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax SolveBeforeConstraintSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return solve;
        case 1: return &beforeExpr;
        case 2: return before;
        case 3: return &afterExpr;
        case 4: return semi;
        default: return nullptr;
    }
}